

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToCFFEmbeddedFontWriter.cpp
# Opt level: O0

void __thiscall
Type1ToCFFEmbeddedFontWriter::Type1ToCFFEmbeddedFontWriter(Type1ToCFFEmbeddedFontWriter *this)

{
  Type1ToCFFEmbeddedFontWriter *this_local;
  
  Type1Input::Type1Input(&this->mType1Input);
  InputFile::InputFile(&this->mType1File);
  CFFPrimitiveWriter::CFFPrimitiveWriter(&this->mPrimitivesWriter,(IByteWriter *)0x0);
  OutputStringBufferStream::OutputStringBufferStream(&this->mFontFileStream);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->mStrings);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
  ::map(&this->mNonStandardStringToIndex);
  this->mCharset = (unsigned_short *)0x0;
  return;
}

Assistant:

Type1ToCFFEmbeddedFontWriter::Type1ToCFFEmbeddedFontWriter(void)
{
	mCharset = NULL;
}